

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void basic_suite::test_null(void)

{
  undefined4 local_68;
  value local_64 [2];
  undefined4 local_5c;
  value local_58 [2];
  undefined4 local_50;
  value local_4c [2];
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [1];
  
  decoder.current.view._M_str._7_1_ = 0x82;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[1]>
            ((decoder *)local_38,(uchar (*) [1])((long)&decoder.current.view._M_str + 7));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0x82;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x2a,"void basic_suite::test_null()",local_40,&local_44);
  local_4c[0] = trial::protocol::bintoken::detail::decoder::symbol((decoder *)local_38);
  local_50 = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x2b,"void basic_suite::test_null()",local_4c,&local_50);
  local_58[0] = trial::protocol::bintoken::detail::decoder::category((decoder *)local_38);
  local_5c = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::nullable",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x2c,"void basic_suite::test_null()",local_58,&local_5c);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_38);
  local_64[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_68 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x2e,"void basic_suite::test_null()",local_64,&local_68);
  return;
}

Assistant:

void test_null()
{
    const value_type input[] = { token::code::null };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::null);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::null);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::nullable);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}